

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubicToricLattice.cpp
# Opt level: O3

int __thiscall
CubicToricLattice::neighbour(CubicToricLattice *this,int vertexIndex,string *direction,int sign)

{
  int iVar1;
  invalid_argument *this_00;
  cartesian4 cVar2;
  cartesian4 local_38;
  
  if ((sign == -1) || (sign == 1)) {
    iVar1 = std::__cxx11::string::compare((char *)direction);
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)direction);
      if (iVar1 != 0) {
        iVar1 = std::__cxx11::string::compare((char *)direction);
        if (iVar1 != 0) {
          this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument
                    (this_00,"Direction must be one of \'x\', \'y\' or \'z\'.");
          goto LAB_0012f1d4;
        }
      }
    }
    cVar2 = Lattice::indexToCoordinate(&this->super_Lattice,vertexIndex);
    local_38 = cVar2;
    if (cVar2.w != 1) {
      iVar1 = std::__cxx11::string::compare((char *)direction);
      if (iVar1 == 0) {
        iVar1 = (this->super_Lattice).l;
        local_38.x = ((cVar2.x + sign) % iVar1 + iVar1) % iVar1;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)direction);
        if (iVar1 == 0) {
          iVar1 = (this->super_Lattice).l;
          local_38.y = ((cVar2.y + sign) % iVar1 + iVar1) % iVar1;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)direction);
          if (iVar1 == 0) {
            iVar1 = (this->super_Lattice).l;
            local_38.z = ((cVar2.z + sign) % iVar1 + iVar1) % iVar1;
          }
        }
      }
      iVar1 = Lattice::coordinateToIndex(&this->super_Lattice,&local_38);
      return iVar1;
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Cubic lattice doesn\'t contain w=0 vertices.");
  }
  else {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Sign must be either 1 or -1.");
  }
LAB_0012f1d4:
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

int CubicToricLattice::neighbour(const int vertexIndex, const std::string &direction, const int sign)
{
    if (!(sign == 1 || sign == -1))
    {
        throw std::invalid_argument("Sign must be either 1 or -1.");
    }
    if (!(direction == "x" || direction == "y" || direction == "z"))
    {
        throw std::invalid_argument("Direction must be one of 'x', 'y' or 'z'.");
    }
    cartesian4 coordinate;
    coordinate = indexToCoordinate(vertexIndex);
    if (coordinate.w == 1)
    {
        throw std::invalid_argument("Cubic lattice doesn't contain w=0 vertices.");
    }
    else
    {
        if (direction == "x")
        {
            coordinate.x = (l + ((coordinate.x + sign) % l)) % l;
        }
        else if (direction == "y")
        {
            coordinate.y = (l + ((coordinate.y + sign) % l)) % l;
        }
        else if (direction == "z")
        {
            coordinate.z = (l + ((coordinate.z + sign) % l)) % l;
        }
    }
    // std::cerr << coordinate << std::endl;
    return coordinateToIndex(coordinate);
}